

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_winograd_transform_pack16.h
# Opt level: O0

void ncnn::conv3x3s1_winograd63_transform_output_pack16_avx512
               (Mat *top_blob_tm,Mat *top_blob,Mat *bias,Option *opt)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  long lVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  undefined8 *puVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  __m512 _out05;
  __m512 _out03;
  __m512 _out01;
  __m512 _out04;
  __m512 _out02;
  __m512 _out00;
  __m512 _tmp135c_1;
  __m512 _tmp024c_1;
  __m512 _tmp135b_1;
  __m512 _tmp024b_1;
  __m512 _tmp135a_1;
  __m512 _tmp024a_1;
  __m512 _tmp07;
  __m512 _tmp06;
  __m512 _tmp05;
  __m512 _tmp04;
  __m512 _tmp03;
  __m512 _tmp02;
  __m512 _tmp01;
  __m512 _tmp00;
  int m_3;
  __m512 _tmp5m;
  __m512 _tmp3m;
  __m512 _tmp1m;
  __m512 _tmp4m;
  __m512 _tmp2m;
  __m512 _tmp0m;
  __m512 _tmp135c;
  __m512 _tmp024c;
  __m512 _tmp135b;
  __m512 _tmp024b;
  __m512 _tmp135a;
  __m512 _tmp024a;
  __m512 _out0tm7;
  __m512 _out0tm6;
  __m512 _out0tm5;
  __m512 _out0tm4;
  __m512 _out0tm3;
  __m512 _out0tm2;
  __m512 _out0tm1;
  __m512 _out0tm0;
  int m_2;
  float *output0;
  float *output0_tm_7;
  float *output0_tm_6;
  float *output0_tm_5;
  float *output0_tm_4;
  float *output0_tm_3;
  float *output0_tm_2;
  float *output0_tm_1;
  float *output0_tm_0;
  int j;
  int i;
  float tmp [6] [8] [16];
  __m512 _bias0;
  Mat out0;
  Mat out0_tm;
  int p;
  float *biasptr;
  int tiles;
  int h_tiles;
  int w_tiles;
  int outch;
  int outh;
  int outw;
  Mat *m_1;
  Mat *m;
  undefined8 local_4740;
  undefined8 uStack_4738;
  undefined8 uStack_4730;
  undefined8 uStack_4728;
  undefined8 uStack_4720;
  undefined8 uStack_4718;
  undefined8 uStack_4710;
  undefined8 uStack_4708;
  undefined8 local_46c0;
  undefined8 uStack_46b8;
  undefined8 uStack_46b0;
  undefined8 uStack_46a8;
  undefined8 uStack_46a0;
  undefined8 uStack_4698;
  undefined8 uStack_4690;
  undefined8 uStack_4688;
  undefined8 local_4680;
  undefined8 uStack_4678;
  undefined8 uStack_4670;
  undefined8 uStack_4668;
  undefined8 uStack_4660;
  undefined8 uStack_4658;
  undefined8 uStack_4650;
  undefined8 uStack_4648;
  undefined8 local_4640;
  undefined8 uStack_4638;
  undefined8 uStack_4630;
  undefined8 uStack_4628;
  undefined8 uStack_4620;
  undefined8 uStack_4618;
  undefined8 uStack_4610;
  undefined8 uStack_4608;
  undefined8 local_4600;
  undefined8 uStack_45f8;
  undefined8 uStack_45f0;
  undefined8 uStack_45e8;
  undefined8 uStack_45e0;
  undefined8 uStack_45d8;
  undefined8 uStack_45d0;
  undefined8 uStack_45c8;
  undefined8 local_45c0;
  undefined8 uStack_45b8;
  undefined8 uStack_45b0;
  undefined8 uStack_45a8;
  undefined8 uStack_45a0;
  undefined8 uStack_4598;
  undefined8 uStack_4590;
  undefined8 uStack_4588;
  undefined8 local_4580;
  undefined8 uStack_4578;
  undefined8 uStack_4570;
  undefined8 uStack_4568;
  undefined8 uStack_4560;
  undefined8 uStack_4558;
  undefined8 uStack_4550;
  undefined8 uStack_4548;
  int local_4184;
  undefined8 local_4180;
  undefined8 uStack_4178;
  undefined8 uStack_4170;
  undefined8 uStack_4168;
  undefined8 uStack_4160;
  undefined8 uStack_4158;
  undefined8 uStack_4150;
  undefined8 uStack_4148;
  undefined8 local_4140;
  undefined8 uStack_4138;
  undefined8 uStack_4130;
  undefined8 uStack_4128;
  undefined8 uStack_4120;
  undefined8 uStack_4118;
  undefined8 uStack_4110;
  undefined8 uStack_4108;
  undefined8 local_4100;
  undefined8 uStack_40f8;
  undefined8 uStack_40f0;
  undefined8 uStack_40e8;
  undefined8 uStack_40e0;
  undefined8 uStack_40d8;
  undefined8 uStack_40d0;
  undefined8 uStack_40c8;
  undefined8 local_40c0;
  undefined8 uStack_40b8;
  undefined8 uStack_40b0;
  undefined8 uStack_40a8;
  undefined8 uStack_40a0;
  undefined8 uStack_4098;
  undefined8 uStack_4090;
  undefined8 uStack_4088;
  undefined8 local_4080;
  undefined8 uStack_4078;
  undefined8 uStack_4070;
  undefined8 uStack_4068;
  undefined8 uStack_4060;
  undefined8 uStack_4058;
  undefined8 uStack_4050;
  undefined8 uStack_4048;
  undefined8 local_4040;
  undefined8 uStack_4038;
  undefined8 uStack_4030;
  undefined8 uStack_4028;
  undefined8 uStack_4020;
  undefined8 uStack_4018;
  undefined8 uStack_4010;
  undefined8 uStack_4008;
  int local_3c54;
  undefined8 *local_3c50;
  undefined1 (*local_3c48) [64];
  undefined1 (*local_3c40) [64];
  undefined1 (*local_3c38) [64];
  undefined1 (*local_3c30) [64];
  undefined1 (*local_3c28) [64];
  undefined1 (*local_3c20) [64];
  undefined1 (*local_3c18) [64];
  undefined1 (*local_3c10) [64];
  int local_3c08;
  int local_3c04;
  undefined8 local_3c00 [412];
  int local_2f1c;
  
  iVar1 = *(int *)((long)in_RSI + 0x2c);
  lVar28 = in_RSI[7];
  iVar29 = iVar1 / 6;
  iVar30 = (int)in_RSI[6] / 6;
  iVar31 = iVar29 * iVar30;
  lVar3 = *in_RDX;
  for (local_2f1c = 0; local_2f1c < (int)lVar28; local_2f1c = local_2f1c + 1) {
    lVar4 = *in_RDI;
    lVar5 = in_RDI[8];
    lVar6 = in_RDI[2];
    iVar2 = *(int *)((long)in_RSI + 0x2c);
    lVar7 = *in_RSI;
    lVar8 = in_RSI[8];
    lVar9 = in_RSI[2];
    lVar10 = in_RSI[2];
    if (lVar3 == 0) {
      local_4740 = 0;
      uStack_4738 = 0;
      uStack_4730 = 0;
      uStack_4728 = 0;
      uStack_4720 = 0;
      uStack_4718 = 0;
      uStack_4710 = 0;
      uStack_4708 = 0;
    }
    else {
      puVar32 = (undefined8 *)(lVar3 + (long)(local_2f1c << 4) * 4);
      local_4740 = *puVar32;
      uStack_4738 = puVar32[1];
      uStack_4730 = puVar32[2];
      uStack_4728 = puVar32[3];
      uStack_4720 = puVar32[4];
      uStack_4718 = puVar32[5];
      uStack_4710 = puVar32[6];
      uStack_4708 = puVar32[7];
    }
    local_3c00[0x180] = local_4740;
    local_3c00[0x181] = uStack_4738;
    local_3c00[0x182] = uStack_4730;
    for (local_3c04 = 0; local_3c04 < iVar30; local_3c04 = local_3c04 + 1) {
      for (local_3c08 = 0; local_3c08 < iVar29; local_3c08 = local_3c08 + 1) {
        local_3c10 = (undefined1 (*) [64])
                     (lVar4 + lVar5 * local_2f1c * lVar6 +
                     (long)((local_3c04 * iVar29 + local_3c08) * 0x10) * 4);
        local_3c18 = (undefined1 (*) [64])(*local_3c10 + (long)(iVar31 * 0x10) * 4);
        local_3c20 = (undefined1 (*) [64])(*local_3c10 + (long)(iVar31 * 0x20) * 4);
        local_3c28 = (undefined1 (*) [64])(*local_3c10 + (long)(iVar31 * 0x30) * 4);
        local_3c30 = (undefined1 (*) [64])(*local_3c10 + (long)(iVar31 * 0x40) * 4);
        local_3c38 = (undefined1 (*) [64])(*local_3c10 + (long)(iVar31 * 0x50) * 4);
        local_3c40 = (undefined1 (*) [64])(*local_3c10 + (long)(iVar31 * 0x60) * 4);
        local_3c48 = (undefined1 (*) [64])(*local_3c10 + (long)(iVar31 * 0x70) * 4);
        local_3c50 = (undefined8 *)
                     (lVar7 + lVar8 * local_2f1c * lVar9 +
                      (long)iVar2 * (long)(local_3c04 * 6) * lVar10 + (long)(local_3c08 * 0x60) * 4)
        ;
        for (local_3c54 = 0; local_3c54 < 8; local_3c54 = local_3c54 + 1) {
          auVar51 = *local_3c48;
          auVar41 = vaddps_avx512f(*local_3c18,*local_3c20);
          auVar42 = vsubps_avx512f(*local_3c18,*local_3c20);
          auVar43 = vaddps_avx512f(*local_3c28,*local_3c30);
          auVar44 = vsubps_avx512f(*local_3c28,*local_3c30);
          auVar45 = vaddps_avx512f(*local_3c38,*local_3c40);
          auVar46 = vsubps_avx512f(*local_3c38,*local_3c40);
          auVar47 = vaddps_avx512f(*local_3c10,auVar41);
          auVar48 = vbroadcastss_avx512f(ZEXT416(0x42000000));
          auVar48 = vfmadd213ps_avx512f(auVar45,auVar48,auVar43);
          auVar47 = vaddps_avx512f(auVar47,auVar48);
          auVar48 = vbroadcastss_avx512f(ZEXT416(0x41000000));
          auVar49 = vbroadcastss_avx512f(ZEXT416(0x40800000));
          auVar49 = vfmadd213ps_avx512f(auVar43,auVar49,auVar41);
          auVar48 = vfmadd213ps_avx512f(auVar45,auVar48,auVar49);
          auVar49 = vbroadcastss_avx512f(ZEXT416(0x40000000));
          auVar50 = vbroadcastss_avx512f(ZEXT416(0x41800000));
          auVar41 = vfmadd213ps_avx512f(auVar43,auVar50,auVar41);
          auVar41 = vfmadd213ps_avx512f(auVar45,auVar49,auVar41);
          lVar33 = (long)local_3c54;
          local_4040 = auVar47._0_8_;
          uStack_4038 = auVar47._8_8_;
          uStack_4030 = auVar47._16_8_;
          uStack_4028 = auVar47._24_8_;
          uStack_4020 = auVar47._32_8_;
          uStack_4018 = auVar47._40_8_;
          uStack_4010 = auVar47._48_8_;
          uStack_4008 = auVar47._56_8_;
          local_3c00[lVar33 * 8] = local_4040;
          local_3c00[lVar33 * 8 + 1] = uStack_4038;
          local_3c00[lVar33 * 8 + 2] = uStack_4030;
          local_3c00[lVar33 * 8 + 3] = uStack_4028;
          local_3c00[lVar33 * 8 + 4] = uStack_4020;
          local_3c00[lVar33 * 8 + 5] = uStack_4018;
          local_3c00[lVar33 * 8 + 6] = uStack_4010;
          local_3c00[lVar33 * 8 + 7] = uStack_4008;
          lVar33 = (long)local_3c54;
          local_4080 = auVar48._0_8_;
          uStack_4078 = auVar48._8_8_;
          uStack_4070 = auVar48._16_8_;
          uStack_4068 = auVar48._24_8_;
          uStack_4060 = auVar48._32_8_;
          uStack_4058 = auVar48._40_8_;
          uStack_4050 = auVar48._48_8_;
          uStack_4048 = auVar48._56_8_;
          local_3c00[lVar33 * 8 + 0x80] = local_4080;
          local_3c00[lVar33 * 8 + 0x81] = uStack_4078;
          local_3c00[lVar33 * 8 + 0x82] = uStack_4070;
          local_3c00[lVar33 * 8 + 0x83] = uStack_4068;
          local_3c00[lVar33 * 8 + 0x84] = uStack_4060;
          local_3c00[lVar33 * 8 + 0x85] = uStack_4058;
          local_3c00[lVar33 * 8 + 0x86] = uStack_4050;
          local_3c00[lVar33 * 8 + 0x87] = uStack_4048;
          lVar33 = (long)local_3c54;
          local_40c0 = auVar41._0_8_;
          uStack_40b8 = auVar41._8_8_;
          uStack_40b0 = auVar41._16_8_;
          uStack_40a8 = auVar41._24_8_;
          uStack_40a0 = auVar41._32_8_;
          uStack_4098 = auVar41._40_8_;
          uStack_4090 = auVar41._48_8_;
          uStack_4088 = auVar41._56_8_;
          local_3c00[lVar33 * 8 + 0x100] = local_40c0;
          local_3c00[lVar33 * 8 + 0x101] = uStack_40b8;
          local_3c00[lVar33 * 8 + 0x102] = uStack_40b0;
          local_3c00[lVar33 * 8 + 0x103] = uStack_40a8;
          local_3c00[lVar33 * 8 + 0x104] = uStack_40a0;
          local_3c00[lVar33 * 8 + 0x105] = uStack_4098;
          local_3c00[lVar33 * 8 + 0x106] = uStack_4090;
          local_3c00[lVar33 * 8 + 0x107] = uStack_4088;
          auVar41 = vbroadcastss_avx512f(ZEXT416(0x41800000));
          auVar43 = vbroadcastss_avx512f(ZEXT416(0x40000000));
          auVar43 = vfmadd213ps_avx512f(auVar44,auVar43,auVar42);
          auVar41 = vfmadd213ps_avx512f(auVar46,auVar41,auVar43);
          auVar43 = vbroadcastss_avx512f(ZEXT416(0x40800000));
          auVar45 = vbroadcastss_avx512f(ZEXT416(0x41000000));
          auVar45 = vfmadd213ps_avx512f(auVar44,auVar45,auVar42);
          auVar43 = vfmadd213ps_avx512f(auVar46,auVar43,auVar45);
          auVar51 = vaddps_avx512f(auVar51,auVar42);
          auVar42 = vbroadcastss_avx512f(ZEXT416(0x42000000));
          auVar42 = vfmadd213ps_avx512f(auVar44,auVar42,auVar46);
          auVar51 = vaddps_avx512f(auVar51,auVar42);
          lVar33 = (long)local_3c54;
          local_4100 = auVar41._0_8_;
          uStack_40f8 = auVar41._8_8_;
          uStack_40f0 = auVar41._16_8_;
          uStack_40e8 = auVar41._24_8_;
          uStack_40e0 = auVar41._32_8_;
          uStack_40d8 = auVar41._40_8_;
          uStack_40d0 = auVar41._48_8_;
          uStack_40c8 = auVar41._56_8_;
          local_3c00[lVar33 * 8 + 0x40] = local_4100;
          local_3c00[lVar33 * 8 + 0x41] = uStack_40f8;
          local_3c00[lVar33 * 8 + 0x42] = uStack_40f0;
          local_3c00[lVar33 * 8 + 0x43] = uStack_40e8;
          local_3c00[lVar33 * 8 + 0x44] = uStack_40e0;
          local_3c00[lVar33 * 8 + 0x45] = uStack_40d8;
          local_3c00[lVar33 * 8 + 0x46] = uStack_40d0;
          local_3c00[lVar33 * 8 + 0x47] = uStack_40c8;
          lVar33 = (long)local_3c54;
          local_4140 = auVar43._0_8_;
          uStack_4138 = auVar43._8_8_;
          uStack_4130 = auVar43._16_8_;
          uStack_4128 = auVar43._24_8_;
          uStack_4120 = auVar43._32_8_;
          uStack_4118 = auVar43._40_8_;
          uStack_4110 = auVar43._48_8_;
          uStack_4108 = auVar43._56_8_;
          local_3c00[lVar33 * 8 + 0xc0] = local_4140;
          local_3c00[lVar33 * 8 + 0xc1] = uStack_4138;
          local_3c00[lVar33 * 8 + 0xc2] = uStack_4130;
          local_3c00[lVar33 * 8 + 0xc3] = uStack_4128;
          local_3c00[lVar33 * 8 + 0xc4] = uStack_4120;
          local_3c00[lVar33 * 8 + 0xc5] = uStack_4118;
          local_3c00[lVar33 * 8 + 0xc6] = uStack_4110;
          local_3c00[lVar33 * 8 + 199] = uStack_4108;
          lVar33 = (long)local_3c54;
          local_4180 = auVar51._0_8_;
          uStack_4178 = auVar51._8_8_;
          uStack_4170 = auVar51._16_8_;
          uStack_4168 = auVar51._24_8_;
          uStack_4160 = auVar51._32_8_;
          uStack_4158 = auVar51._40_8_;
          uStack_4150 = auVar51._48_8_;
          uStack_4148 = auVar51._56_8_;
          local_3c00[lVar33 * 8 + 0x140] = local_4180;
          local_3c00[lVar33 * 8 + 0x141] = uStack_4178;
          local_3c00[lVar33 * 8 + 0x142] = uStack_4170;
          local_3c00[lVar33 * 8 + 0x143] = uStack_4168;
          local_3c00[lVar33 * 8 + 0x144] = uStack_4160;
          local_3c00[lVar33 * 8 + 0x145] = uStack_4158;
          local_3c00[lVar33 * 8 + 0x146] = uStack_4150;
          local_3c00[lVar33 * 8 + 0x147] = uStack_4148;
          local_3c10 = (undefined1 (*) [64])(*local_3c10 + (long)(iVar31 * 0x80) * 4);
          local_3c18 = (undefined1 (*) [64])(*local_3c18 + (long)(iVar31 * 0x80) * 4);
          local_3c20 = (undefined1 (*) [64])(*local_3c20 + (long)(iVar31 * 0x80) * 4);
          local_3c28 = (undefined1 (*) [64])(*local_3c28 + (long)(iVar31 * 0x80) * 4);
          local_3c30 = (undefined1 (*) [64])(*local_3c30 + (long)(iVar31 * 0x80) * 4);
          local_3c38 = (undefined1 (*) [64])(*local_3c38 + (long)(iVar31 * 0x80) * 4);
          local_3c40 = (undefined1 (*) [64])(*local_3c40 + (long)(iVar31 * 0x80) * 4);
          local_3c48 = (undefined1 (*) [64])(*local_3c48 + (long)(iVar31 * 0x80) * 4);
        }
        for (local_4184 = 0; local_4184 < 6; local_4184 = local_4184 + 1) {
          lVar33 = (long)local_4184;
          lVar34 = (long)local_4184;
          lVar35 = (long)local_4184;
          lVar36 = (long)local_4184;
          lVar37 = (long)local_4184;
          lVar38 = (long)local_4184;
          lVar39 = (long)local_4184;
          lVar40 = (long)local_4184;
          uVar11 = local_3c00[lVar40 * 0x40 + 0x38];
          uVar12 = local_3c00[lVar40 * 0x40 + 0x39];
          uVar13 = local_3c00[lVar40 * 0x40 + 0x3a];
          uVar14 = local_3c00[lVar40 * 0x40 + 0x3b];
          uVar15 = local_3c00[lVar40 * 0x40 + 0x3c];
          uVar16 = local_3c00[lVar40 * 0x40 + 0x3d];
          uVar17 = local_3c00[lVar40 * 0x40 + 0x3e];
          uVar18 = local_3c00[lVar40 * 0x40 + 0x3f];
          auVar27._8_8_ = local_3c00[lVar34 * 0x40 + 9];
          auVar27._0_8_ = local_3c00[lVar34 * 0x40 + 8];
          auVar27._16_8_ = local_3c00[lVar34 * 0x40 + 10];
          auVar27._24_8_ = local_3c00[lVar34 * 0x40 + 0xb];
          auVar27._32_8_ = local_3c00[lVar34 * 0x40 + 0xc];
          auVar27._40_8_ = local_3c00[lVar34 * 0x40 + 0xd];
          auVar27._48_8_ = local_3c00[lVar34 * 0x40 + 0xe];
          auVar27._56_8_ = local_3c00[lVar34 * 0x40 + 0xf];
          auVar26._8_8_ = local_3c00[lVar35 * 0x40 + 0x11];
          auVar26._0_8_ = local_3c00[lVar35 * 0x40 + 0x10];
          auVar26._16_8_ = local_3c00[lVar35 * 0x40 + 0x12];
          auVar26._24_8_ = local_3c00[lVar35 * 0x40 + 0x13];
          auVar26._32_8_ = local_3c00[lVar35 * 0x40 + 0x14];
          auVar26._40_8_ = local_3c00[lVar35 * 0x40 + 0x15];
          auVar26._48_8_ = local_3c00[lVar35 * 0x40 + 0x16];
          auVar26._56_8_ = local_3c00[lVar35 * 0x40 + 0x17];
          auVar46 = vaddps_avx512f(auVar27,auVar26);
          auVar45._8_8_ = local_3c00[lVar34 * 0x40 + 9];
          auVar45._0_8_ = local_3c00[lVar34 * 0x40 + 8];
          auVar45._16_8_ = local_3c00[lVar34 * 0x40 + 10];
          auVar45._24_8_ = local_3c00[lVar34 * 0x40 + 0xb];
          auVar45._32_8_ = local_3c00[lVar34 * 0x40 + 0xc];
          auVar45._40_8_ = local_3c00[lVar34 * 0x40 + 0xd];
          auVar45._48_8_ = local_3c00[lVar34 * 0x40 + 0xe];
          auVar45._56_8_ = local_3c00[lVar34 * 0x40 + 0xf];
          auVar44._8_8_ = local_3c00[lVar35 * 0x40 + 0x11];
          auVar44._0_8_ = local_3c00[lVar35 * 0x40 + 0x10];
          auVar44._16_8_ = local_3c00[lVar35 * 0x40 + 0x12];
          auVar44._24_8_ = local_3c00[lVar35 * 0x40 + 0x13];
          auVar44._32_8_ = local_3c00[lVar35 * 0x40 + 0x14];
          auVar44._40_8_ = local_3c00[lVar35 * 0x40 + 0x15];
          auVar44._48_8_ = local_3c00[lVar35 * 0x40 + 0x16];
          auVar44._56_8_ = local_3c00[lVar35 * 0x40 + 0x17];
          auVar44 = vsubps_avx512f(auVar45,auVar44);
          auVar25._8_8_ = local_3c00[lVar36 * 0x40 + 0x19];
          auVar25._0_8_ = local_3c00[lVar36 * 0x40 + 0x18];
          auVar25._16_8_ = local_3c00[lVar36 * 0x40 + 0x1a];
          auVar25._24_8_ = local_3c00[lVar36 * 0x40 + 0x1b];
          auVar25._32_8_ = local_3c00[lVar36 * 0x40 + 0x1c];
          auVar25._40_8_ = local_3c00[lVar36 * 0x40 + 0x1d];
          auVar25._48_8_ = local_3c00[lVar36 * 0x40 + 0x1e];
          auVar25._56_8_ = local_3c00[lVar36 * 0x40 + 0x1f];
          auVar24._8_8_ = local_3c00[lVar37 * 0x40 + 0x21];
          auVar24._0_8_ = local_3c00[lVar37 * 0x40 + 0x20];
          auVar24._16_8_ = local_3c00[lVar37 * 0x40 + 0x22];
          auVar24._24_8_ = local_3c00[lVar37 * 0x40 + 0x23];
          auVar24._32_8_ = local_3c00[lVar37 * 0x40 + 0x24];
          auVar24._40_8_ = local_3c00[lVar37 * 0x40 + 0x25];
          auVar24._48_8_ = local_3c00[lVar37 * 0x40 + 0x26];
          auVar24._56_8_ = local_3c00[lVar37 * 0x40 + 0x27];
          auVar45 = vaddps_avx512f(auVar25,auVar24);
          auVar43._8_8_ = local_3c00[lVar36 * 0x40 + 0x19];
          auVar43._0_8_ = local_3c00[lVar36 * 0x40 + 0x18];
          auVar43._16_8_ = local_3c00[lVar36 * 0x40 + 0x1a];
          auVar43._24_8_ = local_3c00[lVar36 * 0x40 + 0x1b];
          auVar43._32_8_ = local_3c00[lVar36 * 0x40 + 0x1c];
          auVar43._40_8_ = local_3c00[lVar36 * 0x40 + 0x1d];
          auVar43._48_8_ = local_3c00[lVar36 * 0x40 + 0x1e];
          auVar43._56_8_ = local_3c00[lVar36 * 0x40 + 0x1f];
          auVar42._8_8_ = local_3c00[lVar37 * 0x40 + 0x21];
          auVar42._0_8_ = local_3c00[lVar37 * 0x40 + 0x20];
          auVar42._16_8_ = local_3c00[lVar37 * 0x40 + 0x22];
          auVar42._24_8_ = local_3c00[lVar37 * 0x40 + 0x23];
          auVar42._32_8_ = local_3c00[lVar37 * 0x40 + 0x24];
          auVar42._40_8_ = local_3c00[lVar37 * 0x40 + 0x25];
          auVar42._48_8_ = local_3c00[lVar37 * 0x40 + 0x26];
          auVar42._56_8_ = local_3c00[lVar37 * 0x40 + 0x27];
          auVar42 = vsubps_avx512f(auVar43,auVar42);
          auVar23._8_8_ = local_3c00[lVar38 * 0x40 + 0x29];
          auVar23._0_8_ = local_3c00[lVar38 * 0x40 + 0x28];
          auVar23._16_8_ = local_3c00[lVar38 * 0x40 + 0x2a];
          auVar23._24_8_ = local_3c00[lVar38 * 0x40 + 0x2b];
          auVar23._32_8_ = local_3c00[lVar38 * 0x40 + 0x2c];
          auVar23._40_8_ = local_3c00[lVar38 * 0x40 + 0x2d];
          auVar23._48_8_ = local_3c00[lVar38 * 0x40 + 0x2e];
          auVar23._56_8_ = local_3c00[lVar38 * 0x40 + 0x2f];
          auVar22._8_8_ = local_3c00[lVar39 * 0x40 + 0x31];
          auVar22._0_8_ = local_3c00[lVar39 * 0x40 + 0x30];
          auVar22._16_8_ = local_3c00[lVar39 * 0x40 + 0x32];
          auVar22._24_8_ = local_3c00[lVar39 * 0x40 + 0x33];
          auVar22._32_8_ = local_3c00[lVar39 * 0x40 + 0x34];
          auVar22._40_8_ = local_3c00[lVar39 * 0x40 + 0x35];
          auVar22._48_8_ = local_3c00[lVar39 * 0x40 + 0x36];
          auVar22._56_8_ = local_3c00[lVar39 * 0x40 + 0x37];
          auVar43 = vaddps_avx512f(auVar23,auVar22);
          auVar41._8_8_ = local_3c00[lVar38 * 0x40 + 0x29];
          auVar41._0_8_ = local_3c00[lVar38 * 0x40 + 0x28];
          auVar41._16_8_ = local_3c00[lVar38 * 0x40 + 0x2a];
          auVar41._24_8_ = local_3c00[lVar38 * 0x40 + 0x2b];
          auVar41._32_8_ = local_3c00[lVar38 * 0x40 + 0x2c];
          auVar41._40_8_ = local_3c00[lVar38 * 0x40 + 0x2d];
          auVar41._48_8_ = local_3c00[lVar38 * 0x40 + 0x2e];
          auVar41._56_8_ = local_3c00[lVar38 * 0x40 + 0x2f];
          auVar51._8_8_ = local_3c00[lVar39 * 0x40 + 0x31];
          auVar51._0_8_ = local_3c00[lVar39 * 0x40 + 0x30];
          auVar51._16_8_ = local_3c00[lVar39 * 0x40 + 0x32];
          auVar51._24_8_ = local_3c00[lVar39 * 0x40 + 0x33];
          auVar51._32_8_ = local_3c00[lVar39 * 0x40 + 0x34];
          auVar51._40_8_ = local_3c00[lVar39 * 0x40 + 0x35];
          auVar51._48_8_ = local_3c00[lVar39 * 0x40 + 0x36];
          auVar51._56_8_ = local_3c00[lVar39 * 0x40 + 0x37];
          auVar51 = vsubps_avx512f(auVar41,auVar51);
          auVar21._8_8_ = local_3c00[lVar33 * 0x40 + 1];
          auVar21._0_8_ = local_3c00[lVar33 * 0x40];
          auVar21._16_8_ = local_3c00[lVar33 * 0x40 + 2];
          auVar21._24_8_ = local_3c00[lVar33 * 0x40 + 3];
          auVar21._32_8_ = local_3c00[lVar33 * 0x40 + 4];
          auVar21._40_8_ = local_3c00[lVar33 * 0x40 + 5];
          auVar21._48_8_ = local_3c00[lVar33 * 0x40 + 6];
          auVar21._56_8_ = local_3c00[lVar33 * 0x40 + 7];
          auVar41 = vaddps_avx512f(auVar21,auVar46);
          auVar47 = vbroadcastss_avx512f(ZEXT416(0x42000000));
          auVar47 = vfmadd213ps_avx512f(auVar43,auVar47,auVar45);
          auVar41 = vaddps_avx512f(auVar41,auVar47);
          auVar20._8_8_ = local_3c00[0x181];
          auVar20._0_8_ = local_3c00[0x180];
          auVar20._16_8_ = local_3c00[0x182];
          auVar20._24_8_ = uStack_4728;
          auVar20._32_8_ = uStack_4720;
          auVar20._40_8_ = uStack_4718;
          auVar20._48_8_ = uStack_4710;
          auVar20._56_8_ = uStack_4708;
          auVar41 = vaddps_avx512f(auVar20,auVar41);
          auVar47 = vbroadcastss_avx512f(ZEXT416(0x41000000));
          auVar48 = vbroadcastss_avx512f(ZEXT416(0x40800000));
          auVar48 = vfmadd213ps_avx512f(auVar45,auVar48,auVar46);
          auVar47 = vfmadd213ps_avx512f(auVar43,auVar47,auVar48);
          auVar19._8_8_ = local_3c00[0x181];
          auVar19._0_8_ = local_3c00[0x180];
          auVar19._16_8_ = local_3c00[0x182];
          auVar19._24_8_ = uStack_4728;
          auVar19._32_8_ = uStack_4720;
          auVar19._40_8_ = uStack_4718;
          auVar19._48_8_ = uStack_4710;
          auVar19._56_8_ = uStack_4708;
          auVar47 = vaddps_avx512f(auVar19,auVar47);
          auVar48 = vbroadcastss_avx512f(ZEXT416(0x40000000));
          auVar49 = vbroadcastss_avx512f(ZEXT416(0x41800000));
          auVar45 = vfmadd213ps_avx512f(auVar45,auVar49,auVar46);
          auVar43 = vfmadd213ps_avx512f(auVar43,auVar48,auVar45);
          auVar50._8_8_ = local_3c00[0x181];
          auVar50._0_8_ = local_3c00[0x180];
          auVar50._16_8_ = local_3c00[0x182];
          auVar50._24_8_ = uStack_4728;
          auVar50._32_8_ = uStack_4720;
          auVar50._40_8_ = uStack_4718;
          auVar50._48_8_ = uStack_4710;
          auVar50._56_8_ = uStack_4708;
          auVar43 = vaddps_avx512f(auVar50,auVar43);
          local_4580 = auVar41._0_8_;
          uStack_4578 = auVar41._8_8_;
          uStack_4570 = auVar41._16_8_;
          uStack_4568 = auVar41._24_8_;
          uStack_4560 = auVar41._32_8_;
          uStack_4558 = auVar41._40_8_;
          uStack_4550 = auVar41._48_8_;
          uStack_4548 = auVar41._56_8_;
          *local_3c50 = local_4580;
          local_3c50[1] = uStack_4578;
          local_3c50[2] = uStack_4570;
          local_3c50[3] = uStack_4568;
          local_3c50[4] = uStack_4560;
          local_3c50[5] = uStack_4558;
          local_3c50[6] = uStack_4550;
          local_3c50[7] = uStack_4548;
          local_45c0 = auVar47._0_8_;
          uStack_45b8 = auVar47._8_8_;
          uStack_45b0 = auVar47._16_8_;
          uStack_45a8 = auVar47._24_8_;
          uStack_45a0 = auVar47._32_8_;
          uStack_4598 = auVar47._40_8_;
          uStack_4590 = auVar47._48_8_;
          uStack_4588 = auVar47._56_8_;
          local_3c50[0x10] = local_45c0;
          local_3c50[0x11] = uStack_45b8;
          local_3c50[0x12] = uStack_45b0;
          local_3c50[0x13] = uStack_45a8;
          local_3c50[0x14] = uStack_45a0;
          local_3c50[0x15] = uStack_4598;
          local_3c50[0x16] = uStack_4590;
          local_3c50[0x17] = uStack_4588;
          local_4600 = auVar43._0_8_;
          uStack_45f8 = auVar43._8_8_;
          uStack_45f0 = auVar43._16_8_;
          uStack_45e8 = auVar43._24_8_;
          uStack_45e0 = auVar43._32_8_;
          uStack_45d8 = auVar43._40_8_;
          uStack_45d0 = auVar43._48_8_;
          uStack_45c8 = auVar43._56_8_;
          local_3c50[0x20] = local_4600;
          local_3c50[0x21] = uStack_45f8;
          local_3c50[0x22] = uStack_45f0;
          local_3c50[0x23] = uStack_45e8;
          local_3c50[0x24] = uStack_45e0;
          local_3c50[0x25] = uStack_45d8;
          local_3c50[0x26] = uStack_45d0;
          local_3c50[0x27] = uStack_45c8;
          auVar41 = vbroadcastss_avx512f(ZEXT416(0x41800000));
          auVar43 = vbroadcastss_avx512f(ZEXT416(0x40000000));
          auVar43 = vfmadd213ps_avx512f(auVar42,auVar43,auVar44);
          auVar41 = vfmadd213ps_avx512f(auVar51,auVar41,auVar43);
          auVar49._8_8_ = local_3c00[0x181];
          auVar49._0_8_ = local_3c00[0x180];
          auVar49._16_8_ = local_3c00[0x182];
          auVar49._24_8_ = uStack_4728;
          auVar49._32_8_ = uStack_4720;
          auVar49._40_8_ = uStack_4718;
          auVar49._48_8_ = uStack_4710;
          auVar49._56_8_ = uStack_4708;
          auVar41 = vaddps_avx512f(auVar49,auVar41);
          auVar43 = vbroadcastss_avx512f(ZEXT416(0x40800000));
          auVar45 = vbroadcastss_avx512f(ZEXT416(0x41000000));
          auVar45 = vfmadd213ps_avx512f(auVar42,auVar45,auVar44);
          auVar43 = vfmadd213ps_avx512f(auVar51,auVar43,auVar45);
          auVar48._8_8_ = local_3c00[0x181];
          auVar48._0_8_ = local_3c00[0x180];
          auVar48._16_8_ = local_3c00[0x182];
          auVar48._24_8_ = uStack_4728;
          auVar48._32_8_ = uStack_4720;
          auVar48._40_8_ = uStack_4718;
          auVar48._48_8_ = uStack_4710;
          auVar48._56_8_ = uStack_4708;
          auVar43 = vaddps_avx512f(auVar48,auVar43);
          auVar47._8_8_ = uVar12;
          auVar47._0_8_ = uVar11;
          auVar47._16_8_ = uVar13;
          auVar47._24_8_ = uVar14;
          auVar47._32_8_ = uVar15;
          auVar47._40_8_ = uVar16;
          auVar47._48_8_ = uVar17;
          auVar47._56_8_ = uVar18;
          auVar44 = vaddps_avx512f(auVar47,auVar44);
          auVar45 = vbroadcastss_avx512f(ZEXT416(0x42000000));
          auVar51 = vfmadd213ps_avx512f(auVar42,auVar45,auVar51);
          auVar51 = vaddps_avx512f(auVar44,auVar51);
          auVar46._8_8_ = local_3c00[0x181];
          auVar46._0_8_ = local_3c00[0x180];
          auVar46._16_8_ = local_3c00[0x182];
          auVar46._24_8_ = uStack_4728;
          auVar46._32_8_ = uStack_4720;
          auVar46._40_8_ = uStack_4718;
          auVar46._48_8_ = uStack_4710;
          auVar46._56_8_ = uStack_4708;
          auVar51 = vaddps_avx512f(auVar46,auVar51);
          local_4640 = auVar41._0_8_;
          uStack_4638 = auVar41._8_8_;
          uStack_4630 = auVar41._16_8_;
          uStack_4628 = auVar41._24_8_;
          uStack_4620 = auVar41._32_8_;
          uStack_4618 = auVar41._40_8_;
          uStack_4610 = auVar41._48_8_;
          uStack_4608 = auVar41._56_8_;
          local_3c50[8] = local_4640;
          local_3c50[9] = uStack_4638;
          local_3c50[10] = uStack_4630;
          local_3c50[0xb] = uStack_4628;
          local_3c50[0xc] = uStack_4620;
          local_3c50[0xd] = uStack_4618;
          local_3c50[0xe] = uStack_4610;
          local_3c50[0xf] = uStack_4608;
          local_4680 = auVar43._0_8_;
          uStack_4678 = auVar43._8_8_;
          uStack_4670 = auVar43._16_8_;
          uStack_4668 = auVar43._24_8_;
          uStack_4660 = auVar43._32_8_;
          uStack_4658 = auVar43._40_8_;
          uStack_4650 = auVar43._48_8_;
          uStack_4648 = auVar43._56_8_;
          local_3c50[0x18] = local_4680;
          local_3c50[0x19] = uStack_4678;
          local_3c50[0x1a] = uStack_4670;
          local_3c50[0x1b] = uStack_4668;
          local_3c50[0x1c] = uStack_4660;
          local_3c50[0x1d] = uStack_4658;
          local_3c50[0x1e] = uStack_4650;
          local_3c50[0x1f] = uStack_4648;
          local_46c0 = auVar51._0_8_;
          uStack_46b8 = auVar51._8_8_;
          uStack_46b0 = auVar51._16_8_;
          uStack_46a8 = auVar51._24_8_;
          uStack_46a0 = auVar51._32_8_;
          uStack_4698 = auVar51._40_8_;
          uStack_4690 = auVar51._48_8_;
          uStack_4688 = auVar51._56_8_;
          local_3c50[0x28] = local_46c0;
          local_3c50[0x29] = uStack_46b8;
          local_3c50[0x2a] = uStack_46b0;
          local_3c50[0x2b] = uStack_46a8;
          local_3c50[0x2c] = uStack_46a0;
          local_3c50[0x2d] = uStack_4698;
          local_3c50[0x2e] = uStack_4690;
          local_3c50[0x2f] = uStack_4688;
          local_3c50 = (undefined8 *)((long)local_3c50 + (long)(iVar1 << 4) * 4);
        }
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd63_transform_output_pack16_avx512(const Mat& top_blob_tm, Mat& top_blob, const Mat& bias, const Option& opt)
{
    const int outw = top_blob.w;
    const int outh = top_blob.h;
    const int outch = top_blob.c;

    const int w_tiles = outw / 6;
    const int h_tiles = outh / 6;
    const int tiles = w_tiles * h_tiles;

    const float* biasptr = bias;

    // const float otm[6][8] = {
    //     {1.0f,  1.0f,   1.0f,   1.0f,   1.0f,  32.0f, 32.0f, 0.0f},
    //     {0.0f,  1.0f,  -1.0f,   2.0f,  -2.0f,  16.0f,-16.0f, 0.0f},
    //     {0.0f,  1.0f,   1.0f,   4.0f,   4.0f,   8.0f,  8.0f, 0.0f},
    //     {0.0f,  1.0f,  -1.0f,   8.0f,  -8.0f,   4.0f, -4.0f, 0.0f},
    //     {0.0f,  1.0f,   1.0f,  16.0f,  16.0f,   2.0f,  2.0f, 0.0f},
    //     {0.0f,  1.0f,  -1.0f,  32.0f, -32.0f,   1.0f, -1.0f, 1.0f}
    // };

    // 0 = r0 + (r1 + r2) + (r3 + r4)     + (r5 + r6) * 32
    // 1 =      (r1 - r2) + (r3 - r4) * 2 + (r5 - r6) * 16
    // 2 =      (r1 + r2) + (r3 + r4) * 4 + (r5 + r6) * 8
    // 3 =      (r1 - r2) + (r3 - r4) * 8 + (r5 - r6) * 4
    // 4 =      (r1 + r2) + (r3 + r4) * 16+ (r5 + r6) * 2
    // 5 = r7 + (r1 - r2) + (r3 - r4) * 32+ (r5 - r6)

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        const Mat out0_tm = top_blob_tm.channel(p);
        Mat out0 = top_blob.channel(p);

        __m512 _bias0 = biasptr ? _mm512_loadu_ps(biasptr + p * 16) : _mm512_setzero_ps();

#ifdef _MSC_VER
        __declspec(align(64))
#else
        __attribute__((aligned(64)))
#endif
        float tmp[6][8][16];

        // tile
        for (int i = 0; i < h_tiles; i++)
        {
            for (int j = 0; j < w_tiles; j++)
            {
                const float* output0_tm_0 = (const float*)out0_tm + (i * w_tiles + j) * 16;
                const float* output0_tm_1 = output0_tm_0 + tiles * 16;
                const float* output0_tm_2 = output0_tm_0 + tiles * 16 * 2;
                const float* output0_tm_3 = output0_tm_0 + tiles * 16 * 3;
                const float* output0_tm_4 = output0_tm_0 + tiles * 16 * 4;
                const float* output0_tm_5 = output0_tm_0 + tiles * 16 * 5;
                const float* output0_tm_6 = output0_tm_0 + tiles * 16 * 6;
                const float* output0_tm_7 = output0_tm_0 + tiles * 16 * 7;

                float* output0 = out0.row(i * 6) + (j * 6) * 16;

                for (int m = 0; m < 8; m++)
                {
                    __m512 _out0tm0 = _mm512_load_ps(output0_tm_0);
                    __m512 _out0tm1 = _mm512_load_ps(output0_tm_1);
                    __m512 _out0tm2 = _mm512_load_ps(output0_tm_2);
                    __m512 _out0tm3 = _mm512_load_ps(output0_tm_3);
                    __m512 _out0tm4 = _mm512_load_ps(output0_tm_4);
                    __m512 _out0tm5 = _mm512_load_ps(output0_tm_5);
                    __m512 _out0tm6 = _mm512_load_ps(output0_tm_6);
                    __m512 _out0tm7 = _mm512_load_ps(output0_tm_7);

                    __m512 _tmp024a = _mm512_add_ps(_out0tm1, _out0tm2);
                    __m512 _tmp135a = _mm512_sub_ps(_out0tm1, _out0tm2);

                    __m512 _tmp024b = _mm512_add_ps(_out0tm3, _out0tm4);
                    __m512 _tmp135b = _mm512_sub_ps(_out0tm3, _out0tm4);

                    __m512 _tmp024c = _mm512_add_ps(_out0tm5, _out0tm6);
                    __m512 _tmp135c = _mm512_sub_ps(_out0tm5, _out0tm6);

                    __m512 _tmp0m = _mm512_add_ps(_mm512_add_ps(_out0tm0, _tmp024a), _mm512_fmadd_ps(_mm512_set1_ps(32.f), _tmp024c, _tmp024b));
                    __m512 _tmp2m = _mm512_fmadd_ps(_mm512_set1_ps(8.f), _tmp024c, _mm512_fmadd_ps(_mm512_set1_ps(4.f), _tmp024b, _tmp024a));
                    __m512 _tmp4m = _mm512_fmadd_ps(_mm512_set1_ps(2.f), _tmp024c, _mm512_fmadd_ps(_mm512_set1_ps(16.f), _tmp024b, _tmp024a));
                    _mm512_store_ps(tmp[0][m], _tmp0m);
                    _mm512_store_ps(tmp[2][m], _tmp2m);
                    _mm512_store_ps(tmp[4][m], _tmp4m);

                    __m512 _tmp1m = _mm512_fmadd_ps(_mm512_set1_ps(16.f), _tmp135c, _mm512_fmadd_ps(_mm512_set1_ps(2.f), _tmp135b, _tmp135a));
                    __m512 _tmp3m = _mm512_fmadd_ps(_mm512_set1_ps(4.f), _tmp135c, _mm512_fmadd_ps(_mm512_set1_ps(8.f), _tmp135b, _tmp135a));
                    __m512 _tmp5m = _mm512_add_ps(_mm512_add_ps(_out0tm7, _tmp135a), _mm512_fmadd_ps(_mm512_set1_ps(32.f), _tmp135b, _tmp135c));
                    _mm512_store_ps(tmp[1][m], _tmp1m);
                    _mm512_store_ps(tmp[3][m], _tmp3m);
                    _mm512_store_ps(tmp[5][m], _tmp5m);

                    output0_tm_0 += tiles * 128;
                    output0_tm_1 += tiles * 128;
                    output0_tm_2 += tiles * 128;
                    output0_tm_3 += tiles * 128;
                    output0_tm_4 += tiles * 128;
                    output0_tm_5 += tiles * 128;
                    output0_tm_6 += tiles * 128;
                    output0_tm_7 += tiles * 128;
                }

                for (int m = 0; m < 6; m++)
                {
                    __m512 _tmp00 = _mm512_load_ps(tmp[m][0]);
                    __m512 _tmp01 = _mm512_load_ps(tmp[m][1]);
                    __m512 _tmp02 = _mm512_load_ps(tmp[m][2]);
                    __m512 _tmp03 = _mm512_load_ps(tmp[m][3]);
                    __m512 _tmp04 = _mm512_load_ps(tmp[m][4]);
                    __m512 _tmp05 = _mm512_load_ps(tmp[m][5]);
                    __m512 _tmp06 = _mm512_load_ps(tmp[m][6]);
                    __m512 _tmp07 = _mm512_load_ps(tmp[m][7]);

                    __m512 _tmp024a = _mm512_add_ps(_tmp01, _tmp02);
                    __m512 _tmp135a = _mm512_sub_ps(_tmp01, _tmp02);

                    __m512 _tmp024b = _mm512_add_ps(_tmp03, _tmp04);
                    __m512 _tmp135b = _mm512_sub_ps(_tmp03, _tmp04);

                    __m512 _tmp024c = _mm512_add_ps(_tmp05, _tmp06);
                    __m512 _tmp135c = _mm512_sub_ps(_tmp05, _tmp06);

                    __m512 _out00 = _mm512_add_ps(_bias0, _mm512_add_ps(_mm512_add_ps(_tmp00, _tmp024a), _mm512_fmadd_ps(_mm512_set1_ps(32.f), _tmp024c, _tmp024b)));
                    __m512 _out02 = _mm512_add_ps(_bias0, _mm512_fmadd_ps(_mm512_set1_ps(8.f), _tmp024c, _mm512_fmadd_ps(_mm512_set1_ps(4.f), _tmp024b, _tmp024a)));
                    __m512 _out04 = _mm512_add_ps(_bias0, _mm512_fmadd_ps(_mm512_set1_ps(2.f), _tmp024c, _mm512_fmadd_ps(_mm512_set1_ps(16.f), _tmp024b, _tmp024a)));
                    _mm512_store_ps(output0, _out00);
                    _mm512_store_ps(output0 + 32, _out02);
                    _mm512_store_ps(output0 + 64, _out04);

                    __m512 _out01 = _mm512_add_ps(_bias0, _mm512_fmadd_ps(_mm512_set1_ps(16.f), _tmp135c, _mm512_fmadd_ps(_mm512_set1_ps(2.f), _tmp135b, _tmp135a)));
                    __m512 _out03 = _mm512_add_ps(_bias0, _mm512_fmadd_ps(_mm512_set1_ps(4.f), _tmp135c, _mm512_fmadd_ps(_mm512_set1_ps(8.f), _tmp135b, _tmp135a)));
                    __m512 _out05 = _mm512_add_ps(_bias0, _mm512_add_ps(_mm512_add_ps(_tmp07, _tmp135a), _mm512_fmadd_ps(_mm512_set1_ps(32.f), _tmp135b, _tmp135c)));
                    _mm512_store_ps(output0 + 16, _out01);
                    _mm512_store_ps(output0 + 48, _out03);
                    _mm512_store_ps(output0 + 80, _out05);

                    output0 += outw * 16;
                }
            }
        }
    }
}